

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rendering.cpp
# Opt level: O0

void duckdb::CloseBracket
               (vector<unsigned_long,_true> *brackets,vector<unsigned_long,_true> *cursor_brackets,
               idx_t pos,idx_t i,vector<unsigned_long,_true> *errors)

{
  value_type vVar1;
  bool bVar2;
  size_type sVar3;
  reference pvVar4;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_RCX;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_RDX;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_RSI;
  value_type_conflict1 *in_R8;
  
  if (in_RDX == in_RCX) {
    vector<unsigned_long,_true>::clear((vector<unsigned_long,_true> *)0x204013);
  }
  bVar2 = ::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::empty(in_RCX);
  if (bVar2) {
    ::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back(in_RCX,in_R8);
  }
  else {
    sVar3 = ::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size(in_RSI);
    if (sVar3 == 1) {
      pvVar4 = vector<unsigned_long,_true>::back(errors);
      vVar1 = *pvVar4;
      pvVar4 = vector<unsigned_long,_true>::back(errors);
      if (vVar1 == *pvVar4) {
        ::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back(in_RCX,in_R8);
      }
    }
    else {
      bVar2 = ::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::empty(in_RCX);
      if ((bVar2) &&
         (((in_RDX == in_RCX ||
           ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
            ((long)&(in_RCX->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                    _M_impl.super__Vector_impl_data._M_start + 1) == in_RDX)) ||
          ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
           ((long)&(in_RDX->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                   _M_impl.super__Vector_impl_data._M_start + 1) == in_RCX)))) {
        ::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back(in_RCX,in_R8);
        vector<unsigned_long,_true>::back(errors);
        ::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back(in_RCX,in_R8);
      }
    }
    ::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::pop_back
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x2040f7);
  }
  return;
}

Assistant:

static void CloseBracket(vector<idx_t> &brackets, vector<idx_t> &cursor_brackets, idx_t pos, idx_t i,
                         vector<idx_t> &errors) {
	if (pos == i) {
		// cursor is on this closing bracket
		// clear any selected brackets - we always select this one
		cursor_brackets.clear();
	}
	if (brackets.empty()) {
		// closing bracket without matching opening bracket
		errors.push_back(i);
	} else {
		if (cursor_brackets.size() == 1) {
			if (cursor_brackets.back() == brackets.back()) {
				// this closing bracket matches the highlighted opening cursor bracket - highlight both
				cursor_brackets.push_back(i);
			}
		} else if (cursor_brackets.empty() && (pos == i || (i + 1) == pos || (pos + 1) == i)) {
			// no cursor bracket selected yet and cursor is BEFORE or AFTER this bracket
			// add this bracket
			cursor_brackets.push_back(i);
			cursor_brackets.push_back(brackets.back());
		}
		brackets.pop_back();
	}
}